

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecAnalyzerResults.cpp
# Opt level: O0

void __thiscall HdmiCecAnalyzerResults::GenACKBubble(HdmiCecAnalyzerResults *this,Frame *frame)

{
  char *local_138;
  char *local_120;
  char *local_108;
  allocator local_e9;
  string local_e8 [32];
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [39];
  byte local_19;
  Frame *pFStack_18;
  bool ack;
  Frame *frame_local;
  HdmiCecAnalyzerResults *this_local;
  
  local_19 = *(long *)(frame + 0x10) != 0;
  pFStack_18 = frame;
  frame_local = (Frame *)this;
  if ((this->mTabular & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"A",&local_41);
    AddResult(this,(string *)local_40);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    if ((local_19 & 1) == 0) {
      local_108 = "A=0";
    }
    else {
      local_108 = "A=1";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,local_108,&local_79);
    AddResult(this,(string *)local_78);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    if ((local_19 & 1) == 0) {
      local_120 = "ACK=0";
    }
    else {
      local_120 = "ACK=1";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,local_120,&local_a1);
    AddResult(this,(string *)local_a0);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  }
  if ((local_19 & 1) == 0) {
    local_138 = "A=0";
  }
  else {
    local_138 = "A=1";
  }
  local_138 = local_138 + 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e8,local_138,&local_e9);
  std::operator+((char *)local_c8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "Acknowledgment = ");
  AddResult(this,local_c8);
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  return;
}

Assistant:

void HdmiCecAnalyzerResults::GenACKBubble( const Frame& frame )
{
    bool ack = frame.mData1;

    if( !mTabular )
    {
        AddResult( "A" );
        AddResult( ack ? "A=1" : "A=0" );
        AddResult( ack ? "ACK=1" : "ACK=0" );
    }
    AddResult( "Acknowledgment = " + std::string( ack ? "1" : "0" ) );
}